

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall
mjs::labelled_statement::labelled_statement
          (labelled_statement *this,source_extend *extend,wstring *id,statement_ptr *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pwVar2;
  uint32_t uVar3;
  
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__syntax_node_001ea010;
  (this->super_statement).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->super_statement).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  uVar3 = extend->end;
  (this->super_statement).super_syntax_node.extend_.start = extend->start;
  (this->super_statement).super_syntax_node.extend_.end = uVar3;
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__labelled_statement_001ed948;
  (this->id_)._M_dataplus._M_p = (pointer)&(this->id_).field_2;
  pwVar2 = (id->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->id_,pwVar2,pwVar2 + id->_M_string_length);
  (this->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
       (s->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
       super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (s->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  if ((this->id_)._M_string_length != 0) {
    if ((this->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
        _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
        super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl != (statement *)0x0) {
      return;
    }
    __assert_fail("s_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x32d,
                  "mjs::labelled_statement::labelled_statement(const source_extend &, const std::wstring &, statement_ptr &&)"
                 );
  }
  __assert_fail("!id_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x32c,
                "mjs::labelled_statement::labelled_statement(const source_extend &, const std::wstring &, statement_ptr &&)"
               );
}

Assistant:

explicit labelled_statement(const source_extend& extend, const std::wstring& id, statement_ptr&& s) : statement(extend), id_(id), s_(std::move(s)) {
        assert(!id_.empty());
        assert(s_);
    }